

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

void __thiscall cmCTestBZR::LogParser::StartElement(LogParser *this)

{
  char **in_RDX;
  string *in_RSI;
  
  StartElement((LogParser *)(this[-1].EmailRegex.endp + 8),in_RSI,in_RDX);
  return;
}

Assistant:

virtual void StartElement(const std::string& name, const char**)
    {
    this->CData.clear();
    if(name == "log")
      {
      this->Rev = Revision();
      this->Changes.clear();
      }
    // affected-files can contain blocks of
    // modified, unknown, renamed, kind-changed, removed, conflicts, added
    else if(name == "modified"
            || name == "renamed"
            || name == "kind-changed")
      {
      this->CurChange = Change();
      this->CurChange.Action = 'M';
      }
    else if(name == "added")
      {
      this->CurChange = Change();
      this->CurChange = 'A';
      }
    else if(name == "removed")
      {
      this->CurChange = Change();
      this->CurChange = 'D';
      }
    else if(name == "unknown"
            || name == "conflicts")
      {
      // Should not happen here
      this->CurChange = Change();
      }
    }